

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadstorage.cpp
# Opt level: O2

void __thiscall
QThreadStorageData::QThreadStorageData(QThreadStorageData *this,_func_void_void_ptr *func)

{
  long lVar1;
  Type *this_00;
  QThreadData *pQVar2;
  pointer pp_Var3;
  QBasicMutex *this_01;
  long lVar4;
  long in_FS_OFFSET;
  undefined1 local_30 [16];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  this_01 = &destructorsMutex;
  local_30._0_8_ = &destructorsMutex;
  QBasicMutex::lock(&destructorsMutex);
  local_30[8] = true;
  this_00 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_destructors>_>::
            operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_destructors>_>
                        *)this_01);
  if (this_00 == (Type *)0x0) {
    pQVar2 = QThreadData::current();
    this->id = (int)(pQVar2->tls).d.size;
  }
  else {
    lVar1 = (this_00->d).size;
    for (lVar4 = 0; lVar1 != lVar4; lVar4 = lVar4 + 1) {
      if ((this_00->d).ptr[lVar4] == (_func_void_void_ptr *)0x0) {
        this->id = (int)lVar4;
        if (lVar1 == lVar4) goto LAB_00385782;
        pp_Var3 = QList<void_(*)(void_*)>::data(this_00);
        pp_Var3[lVar4] = func;
        goto LAB_0038579b;
      }
    }
    this->id = (int)lVar1;
LAB_00385782:
    QList<void_(*)(void_*)>::append(this_00,func);
  }
LAB_0038579b:
  QMutexLocker<QBasicMutex>::~QMutexLocker((QMutexLocker<QBasicMutex> *)local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QThreadStorageData::QThreadStorageData(void (*func)(void *))
{
    QMutexLocker locker(&destructorsMutex);
    DestructorMap *destr = destructors();
    if (!destr) {
        /*
         the destructors vector has already been destroyed, yet a new
         QThreadStorage is being allocated. this can only happen during global
         destruction, at which point we assume that there is only one thread.
         in order to keep QThreadStorage working, we need somewhere to store
         the data, best place we have in this situation is at the tail of the
         current thread's tls vector. the destructor is ignored, since we have
         no where to store it, and no way to actually call it.
         */
        QThreadData *data = QThreadData::current();
        id = data->tls.size();
        DEBUG_MSG("QThreadStorageData: Allocated id %d, destructor %p cannot be stored", id, func);
        return;
    }
    for (id = 0; id < destr->size(); id++) {
        if (destr->at(id) == nullptr)
            break;
    }
    if (id == destr->size()) {
        destr->append(func);
    } else {
        (*destr)[id] = func;
    }
    DEBUG_MSG("QThreadStorageData: Allocated id %d, destructor %p", id, func);
}